

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Matrix * MatrixFrustum(Matrix *__return_storage_ptr__,double left,double right,double bottom,
                      double top,double near,double far)

{
  Matrix *result;
  float fn;
  float tb;
  float rl;
  double far_local;
  double near_local;
  double top_local;
  double bottom_local;
  double right_local;
  double left_local;
  
  memset(__return_storage_ptr__,0,0x40);
  __return_storage_ptr__->m0 = ((float)near * 2.0) / (float)(right - left);
  __return_storage_ptr__->m1 = 0.0;
  __return_storage_ptr__->m2 = 0.0;
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m4 = 0.0;
  __return_storage_ptr__->m5 = ((float)near * 2.0) / (float)(top - bottom);
  __return_storage_ptr__->m6 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m8 = ((float)right + (float)left) / (float)(right - left);
  __return_storage_ptr__->m9 = ((float)top + (float)bottom) / (float)(top - bottom);
  __return_storage_ptr__->m10 = -((float)far + (float)near) / (float)(far - near);
  __return_storage_ptr__->m11 = -1.0;
  __return_storage_ptr__->m12 = 0.0;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m14 = -((float)far * (float)near * 2.0) / (float)(far - near);
  __return_storage_ptr__->m15 = 0.0;
  return __return_storage_ptr__;
}

Assistant:

RMDEF Matrix MatrixFrustum(double left, double right, double bottom, double top, double near, double far)
{
    Matrix result = { 0 };

    float rl = (float)(right - left);
    float tb = (float)(top - bottom);
    float fn = (float)(far - near);

    result.m0 = ((float) near*2.0f)/rl;
    result.m1 = 0.0f;
    result.m2 = 0.0f;
    result.m3 = 0.0f;

    result.m4 = 0.0f;
    result.m5 = ((float) near*2.0f)/tb;
    result.m6 = 0.0f;
    result.m7 = 0.0f;

    result.m8 = ((float)right + (float)left)/rl;
    result.m9 = ((float)top + (float)bottom)/tb;
    result.m10 = -((float)far + (float)near)/fn;
    result.m11 = -1.0f;

    result.m12 = 0.0f;
    result.m13 = 0.0f;
    result.m14 = -((float)far*(float)near*2.0f)/fn;
    result.m15 = 0.0f;

    return result;
}